

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

ostream * __thiscall
wasm::ValidationInfo::fail<wasm::Name,std::__cxx11::string>
          (ValidationInfo *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text,Name curr,
          Function *func)

{
  Name curr_00;
  ostringstream *poVar1;
  ostream *poVar2;
  Module *wasm;
  ostringstream *ret;
  ostringstream *stream;
  Function *func_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text_local;
  ValidationInfo *this_local;
  Name curr_local;
  
  wasm = (Module *)func;
  std::atomic<bool>::store(&this->valid,false,memory_order_seq_cst);
  curr_local.super_IString.str._M_str = (char *)getStream_abi_cxx11_(this,func);
  if ((this->quiet & 1U) == 0) {
    poVar1 = printFailureHeader_abi_cxx11_(this,func);
    poVar2 = std::operator<<((ostream *)poVar1,(string *)text);
    std::operator<<(poVar2,", on \n");
    curr_00.super_IString.str._M_str = (char *)poVar1;
    curr_00.super_IString.str._M_len = (size_t)curr.super_IString.str._M_str;
    curr_local.super_IString.str._M_str =
         (char *)printModuleComponent<wasm::Name,_nullptr>
                           (curr.super_IString.str._M_len,curr_00,(ostringstream *)this->wasm,wasm);
  }
  return (ostream *)curr_local.super_IString.str._M_str;
}

Assistant:

std::ostream& fail(S text, T curr, Function* func) {
    valid.store(false);
    auto& stream = getStream(func);
    if (quiet) {
      return stream;
    }
    auto& ret = printFailureHeader(func);
    ret << text << ", on \n";
    return printModuleComponent(curr, ret, wasm);
  }